

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O1

bool goodform::can_be<long>(any *v)

{
  float __x;
  double __x_00;
  bool bVar1;
  bool bVar2;
  double dVar3;
  bool bVar4;
  unsigned_long *puVar5;
  float *pfVar6;
  double *pdVar7;
  float fVar8;
  
  bVar4 = is<signed_char>(v);
  if (bVar4) {
    get<signed_char>(v);
  }
  else {
    bVar4 = is<short>(v);
    if (bVar4) {
      get<short>(v);
    }
    else {
      bVar4 = is<int>(v);
      if (bVar4) {
        get<int>(v);
      }
      else {
        bVar4 = is<long>(v);
        if (bVar4) {
          get<long>(v);
        }
        else {
          bVar4 = is<unsigned_char>(v);
          if (bVar4) {
            get<unsigned_char>(v);
          }
          else {
            bVar4 = is<unsigned_short>(v);
            if (bVar4) {
              get<unsigned_short>(v);
            }
            else {
              bVar4 = is<unsigned_int>(v);
              if (!bVar4) {
                bVar4 = is<unsigned_long>(v);
                if (bVar4) {
                  puVar5 = get<unsigned_long>(v);
                  return -1 < (long)*puVar5;
                }
                bVar4 = is<float>(v);
                if (bVar4) {
                  pfVar6 = get<float>(v);
                  __x = *pfVar6;
                  fVar8 = floorf(__x);
                  bVar2 = __x <= 9.223372e+18;
                  bVar1 = fVar8 == __x;
                  bVar4 = __x < -9.223372e+18;
                }
                else {
                  bVar4 = is<double>(v);
                  if (!bVar4) {
                    bVar4 = is<long>(v);
                    return bVar4;
                  }
                  pdVar7 = get<double>(v);
                  __x_00 = *pdVar7;
                  dVar3 = floor(__x_00);
                  bVar2 = __x_00 <= 9.223372036854776e+18;
                  bVar1 = dVar3 == __x_00;
                  bVar4 = __x_00 < -9.223372036854776e+18;
                }
                return (bool)(!bVar4 & -bVar1 & -bVar2);
              }
              get<unsigned_int>(v);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool can_be(const any& v)
  {
    if (std::is_integral<T>::value)
    {
      if (is<std::int8_t>(v)) return detail::can_int_fit_value<T>(get<std::int8_t>(v));
      if (is<std::int16_t>(v)) return detail::can_int_fit_value<T>(get<std::int16_t>(v));
      if (is<std::int32_t>(v)) return detail::can_int_fit_value<T>(get<std::int32_t>(v));
      if (is<std::int64_t>(v)) return detail::can_int_fit_value<T>(get<std::int64_t>(v));
      if (is<std::uint8_t>(v)) return detail::can_int_fit_value<T>(get<std::uint8_t>(v));
      if (is<std::uint16_t>(v)) return detail::can_int_fit_value<T>(get<std::uint16_t>(v));
      if (is<std::uint32_t>(v)) return detail::can_int_fit_value<T>(get<std::uint32_t>(v));
      if (is<std::uint64_t>(v)) return detail::can_int_fit_value<T>(get<std::uint64_t>(v));
      if (is<float>(v))
      {
        float tmp = get<float>(v);
        return std::floor(tmp) == tmp && float(std::numeric_limits<T>::max()) >= tmp && float(std::numeric_limits<T>::min()) <= tmp;
      }
      if (is<double>(v))
      {
        double tmp = get<double>(v);
        return std::floor(tmp) == tmp && double(std::numeric_limits<T>::max()) >= tmp && double(std::numeric_limits<T>::min()) <= tmp;
      }
    }
    else if (std::is_same<T, double>::value)
    {
      return true;
    }
    else if (std::is_same<T, float>::value)
    {
      if (!is<double>(v))
        return true;
      else
      {
        float tmp = float(get<double>(v));
        if (double(tmp) == get<double>(v))
          return true;
      }
    }
    return is<T>(v);
  }